

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O1

SegmentList * __thiscall gepard::SegmentApproximator::segments_abi_cxx11_(SegmentApproximator *this)

{
  _List_node_base *p_Var1;
  _Base_ptr p_Var2;
  SegmentApproximator *this_00;
  bool bVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _List_node_base *this_01;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  double dVar10;
  int intersectionY;
  Float y;
  set<int,_std::less<int>,_std::allocator<int>_> ys;
  int local_88;
  int local_84;
  SegmentApproximator *local_80;
  _Rb_tree_node_base *local_78;
  double local_70;
  double local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  splitSegments(this);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (this->_segments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(this->_segments)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var4 != p_Var9) {
    local_78 = p_Var9;
    do {
      p_Var6 = p_Var4[1]._M_parent;
      std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::sort
                ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)p_Var6);
      p_Var7 = *(_Base_ptr *)p_Var6;
      p_Var8 = p_Var7;
      while (p_Var8 != p_Var6) {
        if (p_Var7 == p_Var6) {
          p_Var7 = *(_Base_ptr *)p_Var8;
          p_Var8 = p_Var7;
        }
        else {
          bVar3 = Segment::computeIntersectionY
                            ((Segment *)&p_Var8->_M_left,(Segment *)&p_Var7->_M_left,&local_68);
          if (bVar3) {
            local_70 = local_68;
            dVar10 = floor(local_68);
            local_88 = (int)dVar10;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,&local_88);
            dVar10 = (double)local_88;
            if ((local_70 != dVar10) || (NAN(local_70) || NAN(dVar10))) {
              if (local_70 <= dVar10) {
                __assert_fail("(Float)intersectionY < y",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                              ,0x1f5,"SegmentList *gepard::SegmentApproximator::segments()");
              }
              local_84 = local_88 + 1;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>(&local_60,&local_84);
            }
          }
        }
        p_Var7 = *(_Base_ptr *)p_Var7;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      p_Var9 = local_78;
    } while (p_Var4 != local_78);
  }
  this_00 = local_80;
  for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    insertSegmentList_abi_cxx11_(this_00,p_Var5[1]._M_color);
  }
  splitSegments(this_00);
  this_01 = (_List_node_base *)operator_new(0x18);
  (((_List_base<gepard::Segment,_std::allocator<gepard::Segment>_> *)&this_01->_M_next)->_M_impl).
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  this_01->_M_prev = (_List_node_base *)0x0;
  *(size_t *)(this_01 + 1) = 0;
  this_01->_M_prev = this_01;
  this_01->_M_next = this_01;
  p_Var5 = (this_00->_segments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (p_Var5 == p_Var9) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      return (SegmentList *)this_01;
    }
    p_Var4 = p_Var5[1]._M_parent;
    std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::sort
              ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)p_Var4);
    p_Var6 = *(_Base_ptr *)p_Var4;
    if (p_Var6 == p_Var4) {
LAB_00112439:
      std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::merge
                ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)this_01,
                 (list<gepard::Segment,_std::allocator<gepard::Segment>_> *)p_Var4);
    }
    else {
      bVar3 = false;
      do {
        p_Var7 = p_Var6->_M_right;
        p_Var8 = p_Var6[1]._M_parent;
        dVar10 = (double)p_Var8 - (double)p_Var7;
        if (dVar10 < 1.0) {
          __assert_fail("segment->to.y - segment->from.y >= 1.0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                        ,0x20f,"SegmentList *gepard::SegmentApproximator::segments()");
        }
        if ((dVar10 == 1.0) && (p_Var2 = p_Var6, !NAN(dVar10))) {
          for (; p_Var2 != p_Var4; p_Var2 = *(_Base_ptr *)p_Var2) {
            if (((double)p_Var7 != (double)p_Var2->_M_right) ||
               (NAN((double)p_Var7) || NAN((double)p_Var2->_M_right))) {
              __assert_fail("segment->from.y == furtherSegment->from.y",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                            ,0x212,"SegmentList *gepard::SegmentApproximator::segments()");
            }
            if (((double)p_Var8 != (double)p_Var2[1]._M_parent) ||
               (NAN((double)p_Var8) || NAN((double)p_Var2[1]._M_parent))) {
              __assert_fail("segment->to.y == furtherSegment->to.y",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                            ,0x213,"SegmentList *gepard::SegmentApproximator::segments()");
            }
            p_Var1 = *(_List_node_base **)(p_Var6 + 1);
            if ((double)*(_List_node_base **)(p_Var2 + 1) < (double)p_Var1) {
              if ((double)p_Var1 - (double)*(_List_node_base **)(p_Var2 + 1) <=
                  (double)p_Var2->_M_left - (double)p_Var6->_M_left) {
                *(_List_node_base **)(p_Var2 + 1) = p_Var1;
              }
              else {
                p_Var2->_M_left = p_Var6->_M_left;
                bVar3 = true;
              }
            }
          }
        }
        p_Var6 = *(_Base_ptr *)p_Var6;
      } while (p_Var6 != p_Var4);
      if (!bVar3) goto LAB_00112439;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
    }
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

SegmentList* SegmentApproximator::segments()
{
    // Split segments with all y lines.
    splitSegments();

    // Find all intersection points.
    std::set<int> ys;
    for (auto& currentSegments : _segments) {
        SegmentList* currentList = currentSegments.second;
        currentList->sort();
        SegmentList::iterator currentSegment = currentList->begin();
        for (SegmentList::iterator segment = currentSegment; currentSegment != currentList->end(); ++segment) {
            if (segment != currentList->end()) {
                Float y;
                if (currentSegment->computeIntersectionY(&(*segment), y)) {
                    const int intersectionY = std::floor(y);
                    ys.insert(intersectionY);
                    if ((Float)intersectionY != y) {
                        GD_ASSERT((Float)intersectionY < y);
                        ys.insert(intersectionY + 1);
                    }
                }
            } else {
                segment = ++currentSegment;
            }
        }
    }

    for (auto y : ys) {
        insertSegmentList(y);
    }

    // Split segments with all y lines.
    splitSegments();

    // Merge and sort all segment list.
    SegmentList* segments = new SegmentList();
    for (SegmentTree::iterator currentSegments = _segments.begin(); currentSegments != _segments.end(); ++currentSegments) {
        SegmentList* currentList = currentSegments->second;
        currentList->sort();

        bool needSorting = false;
        // Fix intersection pairs.
        for (SegmentList::iterator segment = currentList->begin(); segment != currentList->end(); ++segment) {
            GD_ASSERT(segment->to.y - segment->from.y >= 1.0);
            if (segment->to.y - segment->from.y == 1.0) {
                for (SegmentList::iterator furtherSegment = segment; furtherSegment != currentList->end() ; ++furtherSegment) {
                    GD_ASSERT(segment->from.y == furtherSegment->from.y);
                    GD_ASSERT(segment->to.y == furtherSegment->to.y);
                    //! \todo(szledan): need to test this assert:
                    //! GD_ASSERT(furtherSegment->from.x >= segment->from.x)
                    if (furtherSegment->to.x < segment->to.x) {
                        if (furtherSegment->from.x - segment->from.x < segment->to.x - furtherSegment->to.x) {
                            furtherSegment->from.x = segment->from.x;
                            needSorting = true;
                        } else {
                            furtherSegment->to.x = segment->to.x;
                        }
                    }
                }
            }
        }
        if (needSorting) {
            --currentSegments;
        } else {
            // Merge segment lists.
            segments->merge(*currentList);
        }
    }

    // Return independent segments.
    return segments;
}